

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validatevulnerability.cpp
# Opt level: O0

void __thiscall
ValidateVulnerability::CheckProbability(ValidateVulnerability *this,OASIS_FLOAT totalProbability)

{
  int probCheck;
  OASIS_FLOAT totalProbability_local;
  ValidateVulnerability *this_local;
  
  if ((int)(totalProbability * 10000.0 + 0.5) != 10000) {
    fprintf(_stderr,
            "ERROR: Probabilities for vulnerability ID %d and intensity bin ID %d do not sum to 1.0 (total probability = %f).\n"
            ,(double)totalProbability,(ulong)(uint)this->prevVulID_,(ulong)(uint)this->prevIntBinID_
           );
    Validate::PrintErrorMessage(&this->super_Validate);
  }
  return;
}

Assistant:

inline void ValidateVulnerability::CheckProbability(const OASIS_FLOAT totalProbability) {

  int probCheck = (int)(totalProbability * 10000 + 0.5);
  if (probCheck != 10000) {

    fprintf(stderr, "ERROR: Probabilities for vulnerability ID %d and"
		    " intensity bin ID %d do not sum to 1.0"
		    " (total probability = %f).\n",
	    prevVulID_, prevIntBinID_, totalProbability);
    PrintErrorMessage();

  }

}